

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

vector<mjs::string,_std::allocator<mjs::string>_> * __thiscall
mjs::object::enumerable_property_names
          (vector<mjs::string,_std::allocator<mjs::string>_> *__return_storage_ptr__,object *this)

{
  object *poVar1;
  
  (__return_storage_ptr__->super__Vector_base<mjs::string,_std::allocator<mjs::string>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::string,_std::allocator<mjs::string>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::string,_std::allocator<mjs::string>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_object[7])(this,__return_storage_ptr__,1);
  if ((this->prototype_).pos_ != 0) {
    poVar1 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,this->heap_);
    (*poVar1->_vptr_object[7])(poVar1,__return_storage_ptr__,1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<string> object::enumerable_property_names() const {
    std::vector<string> names;
    add_own_property_names(names, true);
    if (prototype_) {
        prototype_.dereference(heap()).add_own_property_names(names, true);
    }
    return names;
}